

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltexceptions.h
# Opt level: O0

void __thiscall bad_vulkan_alloc::bad_vulkan_alloc(bad_vulkan_alloc *this,int which,char *_message)

{
  ostream *poVar1;
  char *in_RDX;
  int in_ESI;
  undefined8 *in_RDI;
  string memtype;
  bad_alloc *in_stack_ffffffffffffff50;
  string local_68 [32];
  string local_48 [48];
  char *local_18;
  int local_c;
  
  local_18 = in_RDX;
  local_c = in_ESI;
  std::bad_alloc::bad_alloc(in_stack_ffffffffffffff50);
  *in_RDI = &PTR__bad_vulkan_alloc_00219890;
  std::__cxx11::stringstream::stringstream((stringstream *)(in_RDI + 1));
  std::__cxx11::string::string((string *)(in_RDI + 0x32));
  if (local_c == -0xc) {
    poVar1 = std::operator<<((ostream *)(in_RDI + 3),"Pool fragmented when allocating for ");
    poVar1 = std::operator<<(poVar1,local_18);
    std::operator<<(poVar1,".");
  }
  else {
    std::__cxx11::string::string(local_48);
    if (local_c == -0x3b9bd788) {
      std::__cxx11::string::operator=(local_48,"pool");
    }
    else if (local_c == -2) {
      std::__cxx11::string::operator=(local_48,"device");
    }
    else if (local_c == -1) {
      std::__cxx11::string::operator=(local_48,"host");
    }
    poVar1 = std::operator<<((ostream *)(in_RDI + 3),"Out of ");
    poVar1 = std::operator<<(poVar1,local_48);
    poVar1 = std::operator<<(poVar1," memory for ");
    poVar1 = std::operator<<(poVar1,local_18);
    std::operator<<(poVar1,".");
    std::__cxx11::string::~string(local_48);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::string::operator=((string *)(in_RDI + 0x32),local_68);
  std::__cxx11::string::~string(local_68);
  return;
}

Assistant:

bad_vulkan_alloc(int which, const char* _message) : std::bad_alloc() {
        if (which == FRAGMENTED_POOL) {
            message << "Pool fragmented when allocating for " << _message << ".";
        } else {
          std::string memtype;
            switch (which) {
              case OUT_OF_HOST_MEMORY: memtype = "host"; break;
              case OUT_OF_DEVICE_MEMORY: memtype = "device"; break;
              case OUT_OF_POOL_MEMORY: memtype = "pool"; break;
              default: break;
            }
            message << "Out of " << memtype << " memory for " << _message << ".";
        }
        _what = message.str();
    }